

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

bool __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
try_reentrant_pop(heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                  *this)

{
  ControlBlock *pCVar1;
  reentrant_consume_operation operation;
  reentrant_consume_operation local_20;
  
  pCVar1 = start_consume_impl(this);
  local_20.m_queue = this;
  local_20.m_control = pCVar1;
  if (pCVar1 != (ControlBlock *)0x0) {
    reentrant_consume_operation::commit(&local_20);
  }
  reentrant_consume_operation::~reentrant_consume_operation(&local_20);
  return pCVar1 != (ControlBlock *)0x0;
}

Assistant:

bool try_reentrant_pop() noexcept
        {
            if (auto operation = try_start_reentrant_consume())
            {
                operation.commit();
                return true;
            }
            return false;
        }